

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O1

Gia_Man_t * Gia_SweeperCleanup(Gia_Man_t *p,char *pCommLime)

{
  void *pvVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pNew;
  Abc_Frame_t *pAVar12;
  sat_solver *s;
  ulong uVar13;
  int Fill;
  long lVar14;
  long lVar15;
  long lVar16;
  int iLit;
  timespec ts;
  uint local_5c;
  void *local_58;
  char *local_50;
  Vec_Int_t *local_48;
  timespec local_40;
  
  pvVar1 = p->pData;
  Gia_ManIncrementTravId(p);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  lVar15 = *(long *)((long)pvVar1 + 0x10);
  if (0 < *(int *)(lVar15 + 4)) {
    lVar16 = 0;
    do {
      local_5c = *(uint *)(*(long *)(lVar15 + 8) + lVar16 * 4);
      if (-1 < (int)local_5c) {
        if (p->nObjs <= (int)(local_5c >> 1)) goto LAB_0072da3d;
        Gia_ManExtract_rec(p,(Gia_Obj_t *)((ulong)(p->pObjs + (local_5c >> 1)) & 0xfffffffffffffffe)
                           ,pVVar7);
      }
      lVar16 = lVar16 + 1;
      lVar15 = *(long *)((long)pvVar1 + 0x10);
    } while (lVar16 < *(int *)(lVar15 + 4));
  }
  local_48 = pVVar7;
  p_00 = Gia_ManStart((p->vCis->nSize - p->nRegs) + pVVar7->nSize + 0x65);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  pcVar2 = p->pSpec;
  local_58 = pvVar1;
  local_50 = pCommLime;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  pVVar7 = p->vCis;
  uVar13 = (ulong)(uint)pVVar7->nSize;
  if (p->nRegs < pVVar7->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar13 <= lVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pVVar7->pArray[lVar15];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0072da3d;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) {
LAB_0072da5c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_0072da5c;
      pGVar3[iVar6].Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar7 = p->vCis;
      uVar13 = (ulong)pVVar7->nSize;
    } while (lVar15 < (long)(uVar13 - (long)p->nRegs));
  }
  Gia_ManHashStart(p_00);
  pVVar7 = local_48;
  if (0 < local_48->nSize) {
    lVar15 = 0;
    do {
      iVar6 = pVVar7->pArray[lVar15];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0072da3d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar6;
      uVar13 = *(ulong *)pGVar3;
      if (((int)pGVar3[-(ulong)((uint)uVar13 & 0x1fffffff)].Value < 0) ||
         (uVar5 = (uint)(uVar13 >> 0x20), (int)pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = Gia_ManHashAnd(p_00,(uint)(uVar13 >> 0x1d) & 1 ^
                                  pGVar3[-(ulong)((uint)uVar13 & 0x1fffffff)].Value,
                             pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
      pGVar3->Value = uVar5;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar7->nSize);
  }
  Gia_ManHashStop(p_00);
  pvVar1 = local_58;
  lVar15 = *(long *)((long)local_58 + 0x10);
  if (0 < *(int *)(lVar15 + 4)) {
    lVar16 = *(long *)(lVar15 + 8);
    lVar14 = 0;
    do {
      local_5c = *(uint *)(lVar16 + lVar14 * 4);
      if (-1 < (int)local_5c) {
        if (p->nObjs <= (int)(local_5c >> 1)) {
LAB_0072da3d:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        local_5c = ((uint)(p->pObjs + (local_5c >> 1)) ^ local_5c) & 1 ^
                   *(uint *)(((ulong)(p->pObjs + (local_5c >> 1)) & 0xfffffffffffffffe) + 8);
        *(uint *)(lVar16 + lVar14 * 4) = local_5c;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < *(int *)(lVar15 + 4));
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  iVar6 = Gia_ManHasDangling(p_00);
  pNew = p_00;
  if (iVar6 != 0) {
    pNew = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
  }
  pcVar2 = local_50;
  if (local_50 != (char *)0x0) {
    pAVar12 = Abc_FrameGetGlobalFrame();
    Abc_FrameUpdateGia(pAVar12,pNew);
    pAVar12 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar12,pcVar2);
    pAVar12 = Abc_FrameGetGlobalFrame();
    pNew = Abc_FrameGetGia(pAVar12);
  }
  *(undefined4 *)(*(long *)((long)pvVar1 + 0x30) + 4) = 0;
  sat_solver_delete(*(sat_solver **)((long)pvVar1 + 0x28));
  s = sat_solver_new();
  *(sat_solver **)((long)pvVar1 + 0x28) = s;
  *(undefined4 *)((long)pvVar1 + 0x58) = 1;
  sat_solver_setnvars(s,1000);
  iVar6 = *(int *)((long)pvVar1 + 0x58);
  *(int *)((long)pvVar1 + 0x58) = iVar6 + 1;
  if (iVar6 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  uVar5 = iVar6 * 2;
  local_5c = uVar5;
  if (iVar6 == 0) {
    __assert_fail("Lit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x5a,"void Swp_ManSetObj2Lit(Swp_Man_t *, int, int)");
  }
  pVVar7 = *(Vec_Int_t **)((long)pvVar1 + 0x30);
  Vec_IntFillExtra(pVVar7,1,Fill);
  pvVar1 = local_58;
  if (0 < pVVar7->nSize) {
    *pVVar7->pArray = uVar5;
    if (-1 < (int)local_5c) {
      local_5c = local_5c ^ 1;
      sat_solver_addclause
                (*(sat_solver **)((long)local_58 + 0x28),(lit *)&local_5c,(lit *)&local_58);
      iVar6 = clock_gettime(3,&local_40);
      if (iVar6 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      *(long *)((long)pvVar1 + 0x70) = lVar15;
      pNew->pData = p->pData;
      p->pData = (void *)0x0;
      Gia_ManStop(p);
      return pNew;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10e,"int Abc_LitNot(int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Gia_Man_t * Gia_SweeperCleanup( Gia_Man_t * p, char * pCommLime )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    Vec_Int_t * vObjIds;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit, ProbeId;

    // collect all internal nodes pointed to by currently-used probes
    Gia_ManIncrementTravId( p );
    vObjIds = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        pObj = Gia_Lit2Obj( p, iLit );
        Gia_ManExtract_rec( p, Gia_Regular(pObj), vObjIds );
    }
    // create new manager
    pNew = Gia_ManStart( 1 + Gia_ManPiNum(p) + Vec_IntSize(vObjIds) + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManHashStop( pNew );
    // create outputs
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        pObj = Gia_Lit2Obj( p, iLit );
        iLit = Gia_Regular(pObj)->Value ^ Gia_IsComplement(pObj);
        Vec_IntWriteEntry( pSwp->vProbes, ProbeId, iLit );
    }
    Vec_IntFree( vObjIds );
    // duplicate if needed
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    // execute command line
    if ( pCommLime )
    {
        // set pNew to be current GIA in ABC
        Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), pNew );
        // execute command line pCommLine using Abc_CmdCommandExecute()
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), pCommLime );
        // get pNew to be current GIA in ABC     
        pNew = Abc_FrameGetGia( Abc_FrameGetGlobalFrame() );
    }
    // restart the SAT solver
    Vec_IntClear( pSwp->vId2Lit );
    sat_solver_delete( pSwp->pSat );
    pSwp->pSat         = sat_solver_new();
    pSwp->nSatVars     = 1;
    sat_solver_setnvars( pSwp->pSat, 1000 );
    Swp_ManSetObj2Lit( pSwp, 0, (iLit = Abc_Var2Lit(pSwp->nSatVars++, 0)) );
    iLit = Abc_LitNot(iLit);
    sat_solver_addclause( pSwp->pSat, &iLit, &iLit + 1 );
    pSwp->timeStart    = Abc_Clock();
    // return the result
    pNew->pData = p->pData; p->pData = NULL;
    Gia_ManStop( p );
    return pNew;
}